

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O3

xmlNodePtr xmlXPathNextParent(xmlXPathParserContextPtr ctxt,xmlNodePtr cur)

{
  xmlElementType xVar1;
  xmlXPathContextPtr pxVar2;
  xmlNodePtr pxVar3;
  int iVar4;
  xmlNsPtr ns;
  
  if (ctxt == (xmlXPathParserContextPtr)0x0) {
    return (xmlNodePtr)0x0;
  }
  pxVar2 = ctxt->context;
  if ((cur == (xmlNodePtr)0x0 && pxVar2 != (xmlXPathContextPtr)0x0) &&
     (pxVar3 = pxVar2->node, pxVar3 != (xmlNodePtr)0x0)) {
    xVar1 = pxVar3->type;
    if (XML_XINCLUDE_END < xVar1) {
      return (xmlNodePtr)0x0;
    }
    if ((0x1bd1faU >> (xVar1 & (XML_ATTRIBUTE_DECL|XML_ELEMENT_DECL)) & 1) == 0) {
      if (xVar1 == XML_ATTRIBUTE_NODE) {
        return pxVar3->parent;
      }
      if (xVar1 != XML_NAMESPACE_DECL) {
        return (xmlNodePtr)0x0;
      }
      pxVar3 = (xmlNodePtr)pxVar3->_private;
      if ((pxVar3 != (xmlNodePtr)0x0) && (pxVar3->type != XML_NAMESPACE_DECL)) {
        return pxVar3;
      }
    }
    else {
      pxVar3 = pxVar3->parent;
      if (pxVar3 == (xmlNodePtr)0x0) {
        return (xmlNodePtr)pxVar2->doc;
      }
      if (pxVar3->type != XML_ELEMENT_NODE) {
        return pxVar3;
      }
      if ((*pxVar3->name != ' ') &&
         (iVar4 = xmlStrEqual(pxVar3->name,(xmlChar *)"fake node libxslt"), iVar4 == 0)) {
        return ctxt->context->node->parent;
      }
    }
  }
  return (xmlNodePtr)0x0;
}

Assistant:

xmlNodePtr
xmlXPathNextParent(xmlXPathParserContextPtr ctxt, xmlNodePtr cur) {
    if ((ctxt == NULL) || (ctxt->context == NULL)) return(NULL);
    /*
     * the parent of an attribute or namespace node is the element
     * to which the attribute or namespace node is attached
     * Namespace handling !!!
     */
    if (cur == NULL) {
	if (ctxt->context->node == NULL) return(NULL);
	switch (ctxt->context->node->type) {
            case XML_ELEMENT_NODE:
            case XML_TEXT_NODE:
            case XML_CDATA_SECTION_NODE:
            case XML_ENTITY_REF_NODE:
            case XML_ENTITY_NODE:
            case XML_PI_NODE:
            case XML_COMMENT_NODE:
            case XML_NOTATION_NODE:
            case XML_DTD_NODE:
	    case XML_ELEMENT_DECL:
	    case XML_ATTRIBUTE_DECL:
	    case XML_XINCLUDE_START:
	    case XML_XINCLUDE_END:
	    case XML_ENTITY_DECL:
		if (ctxt->context->node->parent == NULL)
		    return((xmlNodePtr) ctxt->context->doc);
		if ((ctxt->context->node->parent->type == XML_ELEMENT_NODE) &&
		    ((ctxt->context->node->parent->name[0] == ' ') ||
		     (xmlStrEqual(ctxt->context->node->parent->name,
				 BAD_CAST "fake node libxslt"))))
		    return(NULL);
		return(ctxt->context->node->parent);
            case XML_ATTRIBUTE_NODE: {
		xmlAttrPtr att = (xmlAttrPtr) ctxt->context->node;

		return(att->parent);
	    }
            case XML_DOCUMENT_NODE:
            case XML_DOCUMENT_TYPE_NODE:
            case XML_DOCUMENT_FRAG_NODE:
            case XML_HTML_DOCUMENT_NODE:
                return(NULL);
	    case XML_NAMESPACE_DECL: {
		xmlNsPtr ns = (xmlNsPtr) ctxt->context->node;

		if ((ns->next != NULL) &&
		    (ns->next->type != XML_NAMESPACE_DECL))
		    return((xmlNodePtr) ns->next);
                return(NULL);
	    }
	}
    }
    return(NULL);
}